

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExtractEuler.cpp
# Opt level: O2

M44f * anon_unknown.dwarf_47fb2::matrixEulerMatrix_2
                 (M44f *__return_storage_ptr__,M44f *M,Order order)

{
  Eulerf f;
  Euler<float> EStack_28;
  
  Imath_2_5::Euler<float>::Euler(&EStack_28,order);
  Imath_2_5::Euler<float>::extract(&EStack_28,M);
  Imath_2_5::Euler<float>::toMatrix44(__return_storage_ptr__,&EStack_28);
  return __return_storage_ptr__;
}

Assistant:

M44f
matrixEulerMatrix_2 (const M44f &M, Eulerf::Order order)
{
    Eulerf f (order);
    f.extract (M);
    return f.toMatrix44();
}